

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupUnsolvedOutputs(Aig_Man_t *p,int fAddRegs)

{
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int iVar10;
  Aig_Obj_t *p1;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x4b4,"Aig_Man_t *Aig_ManDupUnsolvedOutputs(Aig_Man_t *, int)");
  }
  if (p->nConstrs < 1) {
    p_00 = Aig_ManStart(p->vObjs->nSize);
    pcVar1 = p->pName;
    if (pcVar1 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      sVar5 = strlen(pcVar1);
      pcVar6 = (char *)malloc(sVar5 + 1);
      strcpy(pcVar6,pcVar1);
    }
    p_00->pName = pcVar6;
    pcVar1 = p->pSpec;
    if (pcVar1 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      sVar5 = strlen(pcVar1);
      pcVar6 = (char *)malloc(sVar5 + 1);
      strcpy(pcVar6,pcVar1);
    }
    p_00->pSpec = pcVar6;
    Aig_ManCleanData(p);
    p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    pVVar8 = p->vCis;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar14];
        pAVar7 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
        lVar14 = lVar14 + 1;
        pVVar8 = p->vCis;
      } while (lVar14 < pVVar8->nSize);
    }
    uVar13 = p->nRegs;
    iVar10 = p->nObjs[3];
    if (iVar10 - uVar13 == 0 || iVar10 < (int)uVar13) {
      iVar4 = 0;
    }
    else {
      uVar11 = p->vCos->nSize;
      iVar4 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if (uVar11 <= iVar10 + ~uVar13) {
LAB_006c444f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar12 = 0;
      do {
        iVar4 = iVar4 + (uint)(p->pConst1 !=
                              (Aig_Obj_t *)
                              (*(ulong *)((long)p->vCos->pArray[uVar12] + 8) & 0xfffffffffffffffe));
        uVar12 = uVar12 + 1;
      } while (iVar10 - uVar13 != uVar12);
    }
    if (fAddRegs == 0) {
      p_00->nRegs = 0;
      iVar10 = p->nRegs + p->nTruePis;
    }
    else {
      p_00->nRegs = uVar13;
      iVar10 = p->nTruePis;
    }
    p_00->nTruePis = iVar10;
    p_00->nTruePos = iVar4;
    pVVar8 = p->vObjs;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar14];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar2 & 1) != 0) goto LAB_006c446e;
          uVar12 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar12 + 0x28));
          }
          uVar12 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar12 + 0x28));
          }
          pAVar7 = Aig_And(p_00,pAVar7,p1);
          *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
          pVVar8 = p->vObjs;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar8->nSize);
    }
    iVar10 = p->nRegs;
    iVar4 = p->nObjs[3];
    uVar13 = iVar4 - iVar10;
    if (uVar13 != 0 && iVar10 <= iVar4) {
      lVar14 = 0;
      do {
        if (p->vCos->nSize <= lVar14) goto LAB_006c444f;
        pvVar2 = p->vCos->pArray[lVar14];
        uVar12 = *(ulong *)((long)pvVar2 + 8);
        pAVar7 = (Aig_Obj_t *)(uVar12 & 0xfffffffffffffffe);
        if (p->pConst1 != pAVar7) {
          if (((ulong)pvVar2 & 1) != 0) goto LAB_006c446e;
          if (pAVar7 == (Aig_Obj_t *)0x0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar12 & 1) ^ (ulong)(pAVar7->field_5).pData);
          }
          Aig_ObjCreateCo(p_00,pAVar7);
          iVar10 = p->nRegs;
          iVar4 = p->nObjs[3];
        }
        lVar14 = lVar14 + 1;
        uVar13 = iVar4 - iVar10;
      } while (lVar14 < (int)uVar13);
    }
    if ((fAddRegs != 0) && (pVVar8 = p->vCos, (int)uVar13 < pVVar8->nSize)) {
      uVar12 = (ulong)uVar13;
      do {
        if ((int)uVar13 < 0) goto LAB_006c444f;
        if (((ulong)pVVar8->pArray[uVar12] & 1) != 0) {
LAB_006c446e:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar3 = *(ulong *)((long)pVVar8->pArray[uVar12] + 8);
        uVar9 = uVar3 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        Aig_ObjCreateCo(p_00,pAVar7);
        uVar12 = uVar12 + 1;
        pVVar8 = p->vCos;
      } while ((int)uVar12 < pVVar8->nSize);
    }
    Aig_ManCleanup(p_00);
  }
  else {
    puts("The AIG manager should have no constraints.");
    p_00 = (Aig_Man_t *)0x0;
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupUnsolvedOutputs( Aig_Man_t * p, int fAddRegs )
{ 
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i, nOuts = 0;
    assert( Aig_ManRegNum(p) > 0 );
    if ( p->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the POs
    nOuts = 0;
    Aig_ManForEachPoSeq( p, pObj, i )
        nOuts += ( Aig_ObjFanin0(pObj) != Aig_ManConst1(p) );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = nOuts;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    Aig_ManForEachPoSeq( p, pObj, i )
        if ( Aig_ObjFanin0(pObj) != Aig_ManConst1(p) )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}